

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randtocsv.cpp
# Opt level: O0

void help(void)

{
  fprintf(_stderr,"-r Convert binary OASIS_FLOAT input to csv\n");
  fprintf(_stderr,"-v version\n");
  fprintf(_stderr,"-s skip header\n");
  fprintf(_stderr,"-g generate random numbers\n");
  fprintf(_stderr,"-S seed value\n");
  fprintf(_stderr,"-h help\n");
  return;
}

Assistant:

void help()
{
	fprintf(stderr, "-r Convert binary OASIS_FLOAT input to csv\n");
	fprintf(stderr, "-v version\n");
	fprintf(stderr, "-s skip header\n");
	fprintf(stderr, "-g generate random numbers\n");
	fprintf(stderr, "-S seed value\n");	
	fprintf(stderr, "-h help\n");
}